

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

Dec_Graph_t * Abc_NodeMffcConstants(Abc_ManRst_t *p,Vec_Int_t *vSims)

{
  int iVar1;
  Dec_Graph_t *pDVar2;
  
  iVar1 = Vec_IntEntryLast(vSims);
  if (iVar1 == -1) {
    pDVar2 = Dec_GraphCreateConst1();
  }
  else {
    if (iVar1 != 0) goto LAB_002691ab;
    pDVar2 = Dec_GraphCreateConst0();
  }
  if (pDVar2 != (Dec_Graph_t *)0x0) {
    return pDVar2;
  }
LAB_002691ab:
  __assert_fail("pGraph",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                ,0x4f2,"Dec_Graph_t *Abc_NodeMffcConstants(Abc_ManRst_t *, Vec_Int_t *)");
}

Assistant:

Dec_Graph_t * Abc_NodeMffcConstants( Abc_ManRst_t * p, Vec_Int_t * vSims )
{
    Dec_Graph_t * pGraph = NULL;
    unsigned uRoot;
    // get the root node
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    // get the graph if the node looks constant
    if ( uRoot == 0 )
        pGraph = Dec_GraphCreateConst0();
    else if ( uRoot == ~(unsigned)0 )
        pGraph = Dec_GraphCreateConst1();
    // check the graph
    assert(pGraph);
    if ( Abc_NodeCheckFull( p, pGraph ) )
        return pGraph;
    Dec_GraphFree( pGraph );
    return NULL;
}